

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::Write
          (CopyingFileOutputStream *this,void *buffer,int size)

{
  LogMessage *other;
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (this->is_closed_ == true) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0xee);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: !is_closed_: ");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (size < 1) {
    bVar5 = true;
  }
  else {
    uVar4 = 0;
    do {
      while( true ) {
        sVar1 = write(this->file_,(void *)((ulong)uVar4 + (long)buffer),(long)(int)(size - uVar4));
        iVar3 = (int)sVar1;
        bVar5 = iVar3 != 0;
        if (-1 < iVar3) break;
        piVar2 = __errno_location();
        if (*piVar2 != 4) {
          this->errno_ = *piVar2;
          return false;
        }
      }
    } while ((bVar5) && (uVar4 = uVar4 + iVar3, (int)uVar4 < size));
  }
  return bVar5;
}

Assistant:

bool FileOutputStream::CopyingFileOutputStream::Write(
    const void* buffer, int size) {
  GOOGLE_CHECK(!is_closed_);
  int total_written = 0;

  const uint8* buffer_base = reinterpret_cast<const uint8*>(buffer);

  while (total_written < size) {
    int bytes;
    do {
      bytes = write(file_, buffer_base + total_written, size - total_written);
    } while (bytes < 0 && errno == EINTR);

    if (bytes <= 0) {
      // Write error.

      // FIXME(kenton):  According to the man page, if write() returns zero,
      //   there was no error; write() simply did not write anything.  It's
      //   unclear under what circumstances this might happen, but presumably
      //   errno won't be set in this case.  I am confused as to how such an
      //   event should be handled.  For now I'm treating it as an error, since
      //   retrying seems like it could lead to an infinite loop.  I suspect
      //   this never actually happens anyway.

      if (bytes < 0) {
        errno_ = errno;
      }
      return false;
    }
    total_written += bytes;
  }

  return true;
}